

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

void __thiscall MeshLib::Solid::labelBoundaryEdges(Solid *this)

{
  HalfEdge *pHVar1;
  TreeIterator<MeshLib::Edge> eiter;
  TreeIterator<MeshLib::Edge> local_128;
  
  AVL::TreeIterator<MeshLib::Edge>::TreeIterator(&local_128,&this->m_edges);
  while (local_128.m_finished != true) {
    if ((local_128.m_pointer)->data->m_halfedge[1] == (HalfEdge *)0x0) {
      pHVar1 = (local_128.m_pointer)->data->m_halfedge[0];
      pHVar1->m_vertex->m_boundary = true;
      pHVar1->m_prev->m_vertex->m_boundary = true;
    }
    AVL::TreeIterator<MeshLib::Edge>::operator++(&local_128);
  }
  return;
}

Assistant:

void
Solid:: labelBoundaryEdges()
{
	for( AVL::TreeIterator<Edge> eiter( m_edges ); ! eiter.end() ; ++ eiter )
	{
		Edge  *   edge = *eiter;
		HalfEdge* he[2];

		he[0] = edge->halfedge(0);
		he[1] = edge->halfedge(1);
		
		//label boundary
		if( he[1] == NULL )
		{
			he[0]->vertex()->boundary() = true;
			he[0]->he_prev()->vertex()->boundary()  = true;
		}

	}
}